

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.c
# Opt level: O3

void do_opt(int *ip)

{
  byte bVar1;
  char cVar2;
  ushort *puVar3;
  uint uVar4;
  int iVar5;
  ushort **ppuVar6;
  ulong uVar7;
  byte *pbVar8;
  long lVar9;
  char *stptr;
  char name [32];
  char acStack_59 [41];
  
  ppuVar6 = __ctype_b_loc();
  puVar3 = *ppuVar6;
LAB_0010b52b:
  do {
    uVar7 = (ulong)*ip;
    pbVar8 = (byte *)(prlnbuf + uVar7);
    bVar1 = prlnbuf[uVar7];
    while ((*(byte *)((long)puVar3 + (long)(char)bVar1 * 2 + 1) & 0x20) != 0) {
      uVar4 = (int)uVar7 + 1;
      uVar7 = (ulong)uVar4;
      *ip = uVar4;
      bVar1 = pbVar8[1];
      pbVar8 = pbVar8 + 1;
    }
    iVar5 = (int)uVar7 + 1;
    *ip = iVar5;
    bVar1 = *pbVar8;
  } while (bVar1 == 0x2c);
  if ((bVar1 == 0) || (bVar1 == 0x3b)) {
    if (pass == 1) {
      println();
      return;
    }
    return;
  }
  uVar7 = 0;
  while( true ) {
    do {
    } while (bVar1 == 0x20);
    if ((bVar1 < 0x3c) && ((0x800100000000001U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) break;
    if (uVar7 == 0x20) {
      stptr = "Syntax error!";
      goto LAB_0010b686;
    }
    acStack_59[uVar7 + 1] = bVar1;
    uVar7 = uVar7 + 1;
    lVar9 = (long)iVar5;
    iVar5 = iVar5 + 1;
    *ip = iVar5;
    bVar1 = prlnbuf[lVar9];
  }
  acStack_59[(uVar7 & 0xffffffff) + 1] = '\0';
  lVar9 = (long)((int)uVar7 + -1);
  cVar2 = acStack_59[lVar9 + 1];
  acStack_59[lVar9 + 1] = '\0';
  iVar5 = strcasecmp(acStack_59 + 1,"l");
  if (iVar5 == 0) {
    lVar9 = 0;
  }
  else {
    iVar5 = strcasecmp(acStack_59 + 1,"m");
    if (iVar5 == 0) {
      lVar9 = 1;
    }
    else {
      iVar5 = strcasecmp(acStack_59 + 1,"w");
      if (iVar5 == 0) {
        lVar9 = 2;
      }
      else {
        iVar5 = strcasecmp(acStack_59 + 1,"o");
        lVar9 = 3;
        if (iVar5 != 0) {
          stptr = "Unknown option!";
LAB_0010b686:
          error(stptr);
          return;
        }
      }
    }
  }
  if (cVar2 != '+') goto code_r0x0010b626;
  iVar5 = 1;
  goto LAB_0010b639;
code_r0x0010b626:
  if (cVar2 == '-') {
    iVar5 = 0;
LAB_0010b639:
    asm_opt[lVar9] = iVar5;
  }
  goto LAB_0010b52b;
}

Assistant:

void
do_opt(int *ip)
{
	char c;
	char flag;
	char name[32];
	int  opt;
	int  i;

	for (;;) {
		/* skip spaces */
		while (isspace(prlnbuf[*ip]))
			(*ip)++;

		/* get char */
		c = prlnbuf[(*ip)++];

		/* no option */
		if (c == ',')
			continue;

		/* end of line */
		if (c == ';' || c == '\0')
			break;

		/* extract option */
		i = 0;
		for (;;) {
			if (c == ' ')
				continue;
			if (c == ',' || c == ';' || c == '\0')
				break;
			if (i > 31) {
				error("Syntax error!");
				return;
			}
			name[i++] = c;
			c = prlnbuf[(*ip)++];
		}

		/* get option flag */
		name[i] = '\0';
		flag = name[--i];
		name[i] = '\0';

		/* search option */
		if (!strcasecmp(name, "l"))
			opt = OPT_LIST;
		else if (!strcasecmp(name, "m"))
			opt = OPT_MACRO;
		else if (!strcasecmp(name, "w"))
			opt = OPT_WARNING;
		else if (!strcasecmp(name, "o"))
			opt = OPT_OPTIMIZE;
		else {
			error("Unknown option!");
			return;
		}

		/* set option */
		if (flag == '+')
			asm_opt[opt] = 1;
		if (flag == '-')
			asm_opt[opt] = 0;
	}

	/* output */
	if (pass == LAST_PASS)
		println();
}